

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu540c.c
# Opt level: O0

void vepu540c_h265_set_me_regs
               (H265eV540cHalContext *ctx,H265eSyntax_new *syn,hevc_vepu540c_base *regs)

{
  anon_struct_4_5_1659a2e2_for_reg0220_me_rnge aVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  RK_S32 RVar8;
  bool bVar9;
  uint local_64;
  RK_U32 local_60;
  RK_U32 cur_srch_h;
  RK_U32 cur_srch_2_h;
  RK_U32 cur_srch_8_w;
  RK_U32 ctu_8_w;
  RK_U32 ctu_2_h;
  RK_U32 ramb_h;
  RK_U32 rama_size;
  RK_S32 pic_wdt_align;
  RK_S32 pic_w;
  RK_S32 frm_end;
  RK_S32 frm_sta;
  RK_S32 srch_dwnh;
  RK_S32 srch_uph;
  RK_S32 srch_rgtw;
  RK_S32 srch_lftw;
  RK_S32 y_gmv;
  RK_S32 x_gmv;
  hevc_vepu540c_base *regs_local;
  H265eSyntax_new *syn_local;
  H265eV540cHalContext *ctx_local;
  
  uVar2 = ((((uint)regs->reg0196_enc_rsl & 0x7ff) + 1) * 8 + 0x1f) / 0x20;
  regs->reg0220_me_rnge =
       (anon_struct_4_5_1659a2e2_for_reg0220_me_rnge)
       ((uint)regs->reg0220_me_rnge & 0xfffffff0 | 0xf);
  regs->reg0220_me_rnge =
       (anon_struct_4_5_1659a2e2_for_reg0220_me_rnge)
       ((uint)regs->reg0220_me_rnge & 0xffffff0f | 0xe0);
  regs->reg0220_me_rnge =
       (anon_struct_4_5_1659a2e2_for_reg0220_me_rnge)
       ((uint)regs->reg0220_me_rnge & 0xfffff0ff | 0xc00);
  regs->reg0220_me_rnge =
       (anon_struct_4_5_1659a2e2_for_reg0220_me_rnge)
       ((uint)regs->reg0220_me_rnge & 0xffff0fff | 0xc000);
  regs->reg0221_me_cfg =
       (anon_struct_4_8_812a51db_for_reg0221_me_cfg)
       ((uint)regs->reg0221_me_cfg & 0xffcfffff | 0x300000);
  regs->reg0221_me_cfg =
       (anon_struct_4_8_812a51db_for_reg0221_me_cfg)
       ((uint)regs->reg0221_me_cfg & 0xff3fffff | 0xc00000);
  regs->reg0221_me_cfg =
       (anon_struct_4_8_812a51db_for_reg0221_me_cfg)((uint)regs->reg0221_me_cfg & 0xffffff80 | 0x48)
  ;
  regs->reg0221_me_cfg =
       (anon_struct_4_8_812a51db_for_reg0221_me_cfg)
       ((uint)regs->reg0221_me_cfg & 0xfff0007f | 0x20000);
  regs->reg0221_me_cfg =
       (anon_struct_4_8_812a51db_for_reg0221_me_cfg)((uint)regs->reg0221_me_cfg & 0xf8ffffff);
  regs->reg0221_me_cfg =
       (anon_struct_4_8_812a51db_for_reg0221_me_cfg)((uint)regs->reg0221_me_cfg & 0x8fffffff);
  regs->reg0220_me_rnge =
       (anon_struct_4_5_1659a2e2_for_reg0220_me_rnge)
       ((uint)regs->reg0220_me_rnge & 0xffff | 0x10000);
  uVar3 = (uint)regs->reg0220_me_rnge >> 0xc & 0xf;
  uVar4 = uVar3 * 4;
  uVar5 = ((uint)regs->reg0220_me_rnge >> 8 & 0xf) * 4;
  uVar6 = ((uint)regs->reg0220_me_rnge >> 4 & 0xf) * 2;
  aVar1 = regs->reg0220_me_rnge;
  if ((((syn->pp).field_21.CodingParamToolFlags >> 0x12 & 1) != 0) && (ctx->frame_type != 2)) {
    if (ctx->last_frame_type == 2) {
      regs->reg0222_me_cach =
           (anon_struct_4_8_308f58c5_for_reg0222_me_cach)((uint)regs->reg0222_me_cach & 0x7fffffff);
    }
    else {
      regs->reg0222_me_cach =
           (anon_struct_4_8_308f58c5_for_reg0222_me_cach)
           ((uint)regs->reg0222_me_cach & 0x7fffffff | 0x80000000);
    }
    regs->reg0222_me_cach =
         (anon_struct_4_8_308f58c5_for_reg0222_me_cach)
         ((uint)regs->reg0222_me_cach & 0xbfffffff | 0x40000000);
  }
  if ((int)(uVar3 * -4) < 0) {
    iVar7 = uVar3 * -4 + -0xf;
  }
  else {
    iVar7 = uVar3 * -4;
  }
  pic_w = iVar7 / 0x10;
  if ((int)uVar5 < 0) {
    pic_wdt_align = (uVar2 - 1) + uVar5 / 0x10;
  }
  else {
    pic_wdt_align = (uVar2 - 1) + (uVar5 + 0xf) / 0x10;
  }
  if (pic_w < 0) {
    pic_w = 0;
  }
  else if ((int)(uVar2 - 1) < pic_w) {
    pic_w = uVar2 - 1;
  }
  RVar8 = mpp_clip(pic_wdt_align,0,uVar2 - 1);
  regs->reg0222_me_cach =
       (anon_struct_4_8_308f58c5_for_reg0222_me_cach)
       ((uint)regs->reg0222_me_cach & 0xf003ffff |
       ((((RVar8 - pic_w) + 1) * 0x20) / 0x20 & 0x3ffU) << 0x12);
  if ((int)-(uVar6 % 8) < 0) {
    iVar7 = (int)-(uVar6 % 8) % 8 + 8;
  }
  else {
    iVar7 = (int)-(uVar6 % 8) % 8;
  }
  iVar7 = (int)(iVar7 + uVar6 + ((uint)aVar1 & 0xf) * 2) / 2;
  local_60 = iVar7 + 4;
  regs->reg0222_me_cach =
       (anon_struct_4_8_308f58c5_for_reg0222_me_cach)
       ((uint)regs->reg0222_me_cach & 0xfffffc00 | (iVar7 + 7U >> 2 & 0xff) << 2);
  if ((int)-(uVar4 % 8) < 0) {
    iVar7 = (int)-(uVar4 % 8) % 8 + uVar4 + uVar5 + 0xf;
  }
  else {
    iVar7 = (int)-(uVar4 % 8) % 8 + uVar4 + uVar5 + 7;
  }
  cur_srch_h = iVar7 / 8 + 1;
  local_64 = 4;
  ctu_8_w = local_60;
  while( true ) {
    bVar9 = false;
    if ((local_64 - 4) * ((uint)regs->reg0222_me_cach >> 0x12 & 0x3ff) + ctu_8_w * cur_srch_h <
        0x704) {
      bVar9 = local_64 < ((uint)regs->reg0222_me_cach & 0x3ff);
    }
    if (!bVar9) break;
    local_64 = local_64 + 4;
    if (ctu_8_w < 9) {
      ctu_8_w = 4;
    }
    else {
      ctu_8_w = ctu_8_w - 4;
    }
  }
  if (local_60 == 8) {
    local_64 = local_64 + 4;
    ctu_8_w = 4;
  }
  if (0x704 < (local_64 - 4) * ((uint)regs->reg0222_me_cach >> 0x12 & 0x3ff) + ctu_8_w * cur_srch_h)
  {
    local_64 = local_64 - 4;
  }
  regs->reg0222_me_cach =
       (anon_struct_4_8_308f58c5_for_reg0222_me_cach)
       ((uint)regs->reg0222_me_cach & 0xfffffc00 |
       (local_64 - 4) * ((uint)regs->reg0222_me_cach >> 0x12 & 0x3ff) + cur_srch_h * 4 >> 2 & 0x3ff)
  ;
  regs->reg0222_me_cach =
       (anon_struct_4_8_308f58c5_for_reg0222_me_cach)
       ((uint)regs->reg0222_me_cach & 0xffff07ff | (local_64 >> 1 & 0x1f) << 0xb);
  regs->reg0222_me_cach =
       (anon_struct_4_8_308f58c5_for_reg0222_me_cach)
       ((uint)regs->reg0222_me_cach & 0xcfffffff | 0x10000000);
  return;
}

Assistant:

static void vepu540c_h265_set_me_regs(H265eV540cHalContext *ctx, H265eSyntax_new *syn, hevc_vepu540c_base *regs)
{

    RK_S32 x_gmv = 0;
    RK_S32 y_gmv = 0;
    RK_S32 srch_lftw, srch_rgtw, srch_uph, srch_dwnh;
    RK_S32 frm_sta = 0, frm_end = 0, pic_w = 0;
    RK_S32 pic_wdt_align = ((regs->reg0196_enc_rsl.pic_wd8_m1 + 1) * 8 + 31) / 32 ;


    regs->reg0220_me_rnge.cime_srch_dwnh = 15;
    regs->reg0220_me_rnge.cime_srch_uph = 14;
    regs->reg0220_me_rnge.cime_srch_rgtw = 12;
    regs->reg0220_me_rnge.cime_srch_lftw = 12;
    regs->reg0221_me_cfg.rme_srch_h    = 3;
    regs->reg0221_me_cfg.rme_srch_v    = 3;

    regs->reg0221_me_cfg.srgn_max_num    = 72;
    regs->reg0221_me_cfg.cime_dist_thre    = 1024;
    regs->reg0221_me_cfg.rme_dis      = 0;
    regs->reg0221_me_cfg.fme_dis        = 0;
    regs->reg0220_me_rnge.dlt_frm_num    = 0x1;
    srch_lftw = regs->reg0220_me_rnge.cime_srch_lftw * 4;
    srch_rgtw = regs->reg0220_me_rnge.cime_srch_rgtw * 4;
    srch_uph = regs->reg0220_me_rnge.cime_srch_uph * 2;
    srch_dwnh =  regs->reg0220_me_rnge.cime_srch_dwnh * 2;

    if (syn->pp.sps_temporal_mvp_enabled_flag &&
        (ctx->frame_type != INTRA_FRAME)) {
        if (ctx->last_frame_type == INTRA_FRAME) {
            regs->reg0222_me_cach.colmv_load    = 0;
        } else {
            regs->reg0222_me_cach.colmv_load    = 1;
        }
        regs->reg0222_me_cach.colmv_stor   = 1;
    }
    // calc cme_linebuf_w
    {
        if (x_gmv - srch_lftw < 0) {
            frm_sta = (x_gmv - srch_lftw - 15) / 16;
        } else {
            frm_sta = (x_gmv - srch_lftw) / 16;
        }
        if (x_gmv + srch_rgtw < 0) {
            frm_end = pic_wdt_align - 1 + (x_gmv + srch_rgtw) / 16;
        } else {
            frm_end = pic_wdt_align - 1 + (x_gmv + srch_rgtw + 15) / 16;
        }

        if (frm_sta < 0) {
            frm_sta = 0;
        } else if (frm_sta > pic_wdt_align - 1) {
            frm_sta = pic_wdt_align - 1;
        }
        frm_end = mpp_clip(frm_end, 0, pic_wdt_align - 1);
        pic_w = (frm_end - frm_sta + 1) * 32;
        regs->reg0222_me_cach.cme_linebuf_w = pic_w / 32;
    }

    // calc cime_hgt_rama and cime_size_rama
    {
        RK_U32 rama_size = 1796;
        RK_U32 ramb_h;
        RK_U32 ctu_2_h = 4;
        RK_U32 ctu_8_w = 1 ;
        RK_U32 cur_srch_8_w, cur_srch_2_h, cur_srch_h;

        if ((y_gmv % 8 - srch_uph % 8) < 0) {
            cur_srch_2_h = (8 + (y_gmv % 8 - srch_uph % 8) % 8 + srch_uph + srch_dwnh) / 2 + ctu_2_h;
        } else {
            cur_srch_2_h = ((y_gmv % 8 - srch_uph % 8) % 8 + srch_uph + srch_dwnh) / 2 + ctu_2_h;
        }
        regs->reg0222_me_cach.cime_size_rama = (cur_srch_2_h + 3) / 4 * 4;

        if ((x_gmv % 8 - srch_lftw % 8) < 0) {
            cur_srch_8_w = (8 + (x_gmv % 8 - srch_lftw % 8) % 8 + srch_lftw + srch_rgtw + 7) / 8 + ctu_8_w;
        } else {
            cur_srch_8_w = ((x_gmv % 8 - srch_lftw % 8) % 8 + srch_lftw + srch_rgtw + 7) / 8 + ctu_8_w;
        }

        cur_srch_h = ctu_2_h;
        ramb_h = cur_srch_2_h;
        while ((rama_size > ((cur_srch_h - ctu_2_h) * regs->reg0222_me_cach.cme_linebuf_w + (ramb_h * cur_srch_8_w)))
               && (cur_srch_h < regs->reg0222_me_cach.cime_size_rama)) {
            cur_srch_h = cur_srch_h + ctu_2_h;
            if (ramb_h > ctu_2_h * 2) {
                ramb_h = ramb_h - ctu_2_h;
            } else {
                ramb_h = ctu_2_h;
            }
        }

        if (cur_srch_2_h == ctu_2_h * 2) {
            cur_srch_h = cur_srch_h + ctu_2_h;
            ramb_h = ctu_2_h;
        }

        if (rama_size < ((cur_srch_h - ctu_2_h) * regs->reg0222_me_cach.cme_linebuf_w + (ramb_h * cur_srch_8_w))) {
            cur_srch_h = cur_srch_h - ctu_2_h;
        }

        regs->reg0222_me_cach.cime_size_rama = ((cur_srch_h - ctu_2_h) * regs->reg0222_me_cach.cme_linebuf_w + ctu_2_h * cur_srch_8_w) / 4;
        regs->reg0222_me_cach.cime_hgt_rama = cur_srch_h / 2;
        regs->reg0222_me_cach.fme_prefsu_en = 1;
    }

}